

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# altrace_common.c
# Opt level: O3

StringCache * stringcache_create(void)

{
  StringCache *__ptr;
  StringBucket **ppSVar1;
  
  __ptr = (StringCache *)calloc(1,0x18);
  if (__ptr != (StringCache *)0x0) {
    ppSVar1 = (StringBucket **)calloc(1,0x800);
    __ptr->hashtable = ppSVar1;
    if (ppSVar1 != (StringBucket **)0x0) {
      __ptr->table_size = 0x100;
      return __ptr;
    }
    free(__ptr);
  }
  return (StringCache *)0x0;
}

Assistant:

StringCache *stringcache_create(void)
{
    const uint32 initial_table_size = 256;
    const size_t tablelen = sizeof (StringBucket *) * initial_table_size;
    StringCache *cache = (StringCache *) malloc(sizeof (StringCache));
    if (!cache) {
        return NULL;
    }
    memset(cache, '\0', sizeof (StringCache));

    cache->hashtable = (StringBucket **) malloc(tablelen);
    if (!cache->hashtable)
    {
        free(cache);
        return NULL;
    }
    memset(cache->hashtable, '\0', tablelen);

    cache->table_size = initial_table_size;
    return cache;
}